

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.h
# Opt level: O2

int32_t ra_advance_until(roaring_array_t *ra,uint16_t x,int32_t pos)

{
  uint16_t *puVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  ushort uVar7;
  
  iVar5 = ra->size;
  iVar3 = pos + 1;
  if ((iVar5 <= iVar3) || (puVar1 = ra->keys, x <= puVar1[iVar3])) {
    return iVar3;
  }
  for (iVar4 = 1; iVar6 = iVar4 + iVar3, iVar6 < iVar5; iVar4 = iVar4 * 2) {
    uVar7 = puVar1[iVar6];
    if (x <= uVar7) goto LAB_00102da4;
  }
  uVar7 = puVar1[(long)iVar5 + -1];
  iVar6 = iVar5 + -1;
LAB_00102da4:
  if (uVar7 != x) {
    if (uVar7 < x) {
      return iVar5;
    }
    iVar2 = iVar6;
    iVar5 = (iVar4 >> 1) + iVar3;
    while (iVar6 = iVar2, iVar5 + 1 != iVar6) {
      iVar3 = iVar6 + iVar5 >> 1;
      if (puVar1[iVar3] == x) {
        return iVar3;
      }
      iVar2 = iVar3;
      if (puVar1[iVar3] < x) {
        iVar2 = iVar6;
        iVar5 = iVar3;
      }
    }
  }
  return iVar6;
}

Assistant:

static inline int32_t ra_advance_until(const roaring_array_t *ra, uint16_t x,
                                       int32_t pos) {
    return advanceUntil(ra->keys, pos, ra->size, x);
}